

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,Handle lt,C cRt)

{
  uint uVar1;
  bitset<12UL> bVar2;
  Relations rels;
  long lVar3;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar4;
  Relations relsBound;
  Relations local_48;
  _Base_bitset<1UL> local_40;
  uint local_38 [4];
  
  if (cRt != (C)0x0) {
    local_38[0] = 2;
    local_38[1] = 4;
    local_38[2] = 6;
    local_38[3] = 8;
    lVar3 = 0;
    do {
      uVar1 = *(uint *)((long)local_38 + lVar3);
      if (0xb < (ulong)uVar1) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)uVar1,
                   0xc);
      }
      rels.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(1L << ((byte)uVar1 & 0x3f));
      pVar4 = getBound(this,lt,rels);
      local_40._M_w = (_WordT)pVar4.second.bits.super__Base_bitset<1UL>._M_w;
      if ((pVar4.first != (C)0x0) &&
         (local_48 = compare(pVar4.first,cRt),
         ((ulong)local_48.bits.super__Base_bitset<1UL>._M_w &
         (ulong)rels.bits.super__Base_bitset<1UL>._M_w) != 0)) {
        bVar2.super__Base_bitset<1UL>._M_w =
             (_Base_bitset<1UL>)dg::vr::compose((Relations *)&local_40,&local_48);
        return (Relations)(_WordT)bVar2.super__Base_bitset<1UL>._M_w;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
  }
  return (Relations)0;
}

Assistant:

Relations ValueRelations::_between(Handle lt, C cRt) const {
    if (!cRt)
        return {};

    for (Relations::Type rel :
         {Relations::SLE, Relations::ULE, Relations::SGE, Relations::UGE}) {
        C boundLt;
        Relations relsLt;
        std::tie(boundLt, relsLt) = getBound(lt, Relations().set(rel));

        if (!boundLt)
            continue;

        Relations relsBound = compare(boundLt, cRt);
        // lt <= boundLt <= cRt || lt >= boundLt >= cRt
        if (relsBound.has(rel))
            return compose(relsLt, relsBound);
    }
    return {};
}